

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fontgen.cpp
# Opt level: O3

void generate_image(vector<Glyph,_std::allocator<Glyph>_> *glyphs,int font_height,int border,
                   int image_width,int image_height,string *pgm_filename,string *metadata_filename)

{
  __normal_iterator<Glyph_*,_std::vector<Glyph,_std::allocator<Glyph>_>_> __first;
  __normal_iterator<Glyph_*,_std::vector<Glyph,_std::allocator<Glyph>_>_> __last;
  Bitmap *source;
  long lVar1;
  int x_pos;
  ostream *poVar2;
  ulong uVar3;
  long *plVar4;
  Glyph *glyph;
  pointer pGVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Bitmap image_bitmap;
  ofstream metadata;
  Bitmap local_268;
  string *local_258;
  string local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,(metadata_filename->_M_dataplus)._M_p,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"(pingus-font",0xc);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"  (size ",8);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_230,font_height);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"  (glyph-count ",0xf);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"  (glyphs ",10);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  Bitmap::Bitmap(&local_268,image_width,image_height);
  __first._M_current =
       (glyphs->super__Vector_base<Glyph,_std::allocator<Glyph>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  __last._M_current =
       (glyphs->super__Vector_base<Glyph,_std::allocator<Glyph>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  iVar8 = 0;
  local_258 = pgm_filename;
  if (__first._M_current == __last._M_current) {
    iVar6 = 0;
  }
  else {
    uVar3 = (long)__last._M_current - (long)__first._M_current >> 5;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Glyph*,std::vector<Glyph,std::allocator<Glyph>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Glyph_const&,Glyph_const&)>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_Glyph_&,_const_Glyph_&)>)0x1047cc);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Glyph*,std::vector<Glyph,std::allocator<Glyph>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Glyph_const&,Glyph_const&)>>
              (__first,__last,(_Iter_comp_iter<bool_(*)(const_Glyph_&,_const_Glyph_&)>)0x1047cc);
    pGVar5 = (glyphs->super__Vector_base<Glyph,_std::allocator<Glyph>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar6 = 0;
    iVar8 = 0;
    if (pGVar5 != (glyphs->super__Vector_base<Glyph,_std::allocator<Glyph>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      x_pos = border * 2;
      iVar7 = 0;
      iVar6 = 0;
      iVar8 = 0;
      do {
        source = pGVar5->bitmap;
        if (local_268.width < iVar7 + x_pos + source->width) {
          iVar6 = iVar6 + iVar8 + x_pos;
          iVar8 = source->height;
          Bitmap::blit(&local_268,source,x_pos,iVar6 + border);
          iVar7 = border;
        }
        else {
          if (iVar8 <= source->height) {
            iVar8 = source->height;
          }
          Bitmap::blit(&local_268,source,iVar7 + border,iVar6 + border);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"    (glyph ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"(unicode ",9);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(offset ",8);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pGVar5->x_offset);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pGVar5->y_offset);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(advance ",9);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pGVar5->advance);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(rect ",6);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pGVar5->bitmap->width + iVar7 + x_pos);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar6 + x_pos + pGVar5->bitmap->height);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ;; ",4);
        unicode_to_utf8_abi_cxx11_(&local_250,pGVar5->charcode);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_250._M_dataplus._M_p,local_250._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        iVar7 = iVar7 + x_pos + pGVar5->bitmap->width;
        pGVar5 = pGVar5 + 1;
      } while (pGVar5 != (glyphs->super__Vector_base<Glyph,_std::allocator<Glyph>_>)._M_impl.
                         super__Vector_impl_data._M_finish);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"  ))",4);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,";; EOF ;;",9);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  Bitmap::truncate_height(&local_268,iVar6 + border + iVar8);
  Bitmap::write_pgm(&local_268,local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ImageSize: ",0xb);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_268.width);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"x",1);
  plVar4 = (long *)std::ostream::operator<<(poVar2,local_268.height);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  Bitmap::~Bitmap(&local_268);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void generate_image(std::vector<Glyph>& glyphs,
                    int font_height,
                    int border,
                    int image_width,
                    int image_height,
                    const std::string& pgm_filename,
                    const std::string& metadata_filename)
{
  std::ofstream metadata(metadata_filename.c_str());

  metadata << "(pingus-font" << std::endl;
  metadata << "  (size " << font_height << ")" << std::endl;
  metadata << "  (glyph-count " << glyphs.size() << ")" << std::endl;
  metadata << "  (glyphs " << std::endl;

  Bitmap image_bitmap(image_width, image_height); // FIXME: hardcoded height is evil

  int x_pos = 0;
  int y_pos = 0;
  int row_height = 0;

  std::sort(glyphs.begin(), glyphs.end(), glyhp_height_sorter);

  for(std::vector<Glyph>::iterator i = glyphs.begin(); i != glyphs.end(); ++i)
  {
    Glyph& glyph = *i;

    if (x_pos + glyph.bitmap->get_width() + 2*border > image_bitmap.get_width())
    {
      x_pos = border;
      y_pos += row_height + 2*border;
      row_height = glyph.bitmap->get_height();

      image_bitmap.blit(*glyph.bitmap, x_pos+border, y_pos+border);
    }
    else
    {
      row_height = std::max(row_height, glyph.bitmap->get_height());

      image_bitmap.blit(*glyph.bitmap, x_pos+border, y_pos+border);
    }

    metadata << "    (glyph "
	     << "(unicode " << glyph.charcode << ") "
	     << "(offset " << glyph.x_offset << " " << glyph.y_offset << ") "
	     << "(advance " << glyph.advance << ") "
	     << "(rect "
	     << x_pos << " " << y_pos << " "
	     << x_pos+glyph.bitmap->get_width()+border*2 << " " << y_pos+glyph.bitmap->get_height()+border*2 << ")"
	     << ")"
	     << " ;; " << unicode_to_utf8(glyph.charcode)
	     << std::endl;

    x_pos += glyph.bitmap->get_width() + 2*border;
  }

  metadata << "  ))" << std::endl;
  metadata << ";; EOF ;;" << std::endl;

  image_bitmap.truncate_height(y_pos + row_height + border);
  image_bitmap.write_pgm(pgm_filename);
  std::cout << "ImageSize: " << image_bitmap.get_width() << "x" << image_bitmap.get_height() << std::endl;
}